

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<duckdb::date_t>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  date_t *__y;
  undefined4 extraout_var;
  undefined4 extraout_EDX;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  idx_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  pair<unsigned_long,_duckdb::date_t> local_28;
  ulong local_18;
  ulong local_10 [2];
  
  local_18 = in_RDX;
  for (local_10[0] = in_RSI; local_10[0] < local_18; local_10[0] = local_10[0] + 1) {
    bVar1 = QuantileIncluded<duckdb::date_t>::operator()
                      ((QuantileIncluded<duckdb::date_t> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    if (bVar1) {
      this_00 = (HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
                 *)*in_RDI;
      __y = QuantileCursor<duckdb::date_t>::operator[]
                      ((QuantileCursor<duckdb::date_t> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (idx_t)in_stack_ffffffffffffffc8);
      std::pair<unsigned_long,_duckdb::date_t>::pair<unsigned_long_&,_true>(&local_28,local_10,__y);
      iVar2 = duckdb_skiplistlib::skip_list::
              HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
              ::remove(this_00,(char *)&local_28);
      in_stack_ffffffffffffffc8 = (idx_t *)CONCAT44(extraout_var,iVar2);
      in_stack_ffffffffffffffd0 = extraout_EDX;
    }
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}